

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::RegExprDFAParseElement::ShiftToken
          (RegExprDFAParseElement *this,TokenType *token,
          TokenStream<SGParser::Generator::RegExprParseToken> *stream)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TokenType tempToken;
  
  uVar3 = token->ch;
  (this->field_1).ch = uVar3;
  if ((uVar3 == 0x5c) && ((token->super_TokenCode).Code != 1)) {
    iVar2 = (*stream->_vptr_TokenStream[2])(stream);
    uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 4);
    (this->field_1).ch = uVar3;
    uVar3 = uVar3 - 0x62;
    uVar1 = uVar3 >> 1;
    uVar3 = uVar1 | (uint)((uVar3 & 1) != 0) << 0x1f;
    if ((uVar3 < 0xb) && ((0x745U >> (uVar1 & 0x1f) & 1) != 0)) {
      (this->field_1).ch = *(uint *)(&DAT_0014f408 + (ulong)uVar3 * 4);
    }
  }
  return;
}

Assistant:

void ShiftToken(TokenType& token, TokenStream<TokenType>& stream) {
        ch = token.ch;
        // If we are shifting token, parser will be looking at the next character next
        // So we can do this
        // Essentially, we are ignoring the next token code, and turning it into a character
        if (ch == '\\' && token.Code != TokenCode::TokenEOF) {
            TokenType tempToken;
            ch = stream.GetNextToken(tempToken).ch;
            // Process characters with special meanings
            switch (ch) {
                case 'n': ch='\n'; break;
                case 't': ch='\t'; break;
                case 'v': ch='\v'; break;
                case 'r': ch='\r'; break;
                case 'f': ch='\f'; break;
                case 'b': ch='\b'; break;
                default:           break;
            }
        }
    }